

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddZddSetop.c
# Opt level: O0

DdNode * cuddZddChangeAux(DdManager *zdd,DdNode *P,DdNode *zvar)

{
  DdNode *pDVar1;
  DdNode *E;
  DdNode *empty;
  DdNode *base;
  DdNode *e;
  DdNode *t;
  DdNode *res;
  int level;
  int top_var;
  DdNode *zvar_local;
  DdNode *P_local;
  DdManager *zdd_local;
  
  if (P == zdd->zero) {
    return zdd->zero;
  }
  if (P == zdd->one) {
    return zvar;
  }
  pDVar1 = cuddCacheLookup2Zdd(zdd,cuddZddChangeAux,P,zvar);
  if (pDVar1 != (DdNode *)0x0) {
    return pDVar1;
  }
  if (zdd->permZ[zvar->index] < zdd->permZ[P->index]) {
    t = cuddZddGetNode(zdd,zvar->index,P,zdd->zero);
    if (t == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
  }
  else if (zdd->permZ[P->index] == zdd->permZ[zvar->index]) {
    t = cuddZddGetNode(zdd,zvar->index,(P->type).kids.E,(P->type).kids.T);
    if (t == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
  }
  else {
    pDVar1 = cuddZddChangeAux(zdd,(P->type).kids.T,zvar);
    if (pDVar1 == (DdNode *)0x0) {
      return (DdNode *)0x0;
    }
    *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + 1;
    E = cuddZddChangeAux(zdd,(P->type).kids.E,zvar);
    if (E == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(zdd,pDVar1);
      return (DdNode *)0x0;
    }
    *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + 1;
    t = cuddZddGetNode(zdd,P->index,pDVar1,E);
    if (t == (DdNode *)0x0) {
      Cudd_RecursiveDerefZdd(zdd,pDVar1);
      Cudd_RecursiveDerefZdd(zdd,E);
      return (DdNode *)0x0;
    }
    *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)pDVar1 & 0xfffffffffffffffe) + 4) + -1;
    *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) =
         *(int *)(((ulong)E & 0xfffffffffffffffe) + 4) + -1;
  }
  cuddCacheInsert2(zdd,cuddZddChangeAux,P,zvar,t);
  return t;
}

Assistant:

DdNode *
cuddZddChangeAux(
  DdManager * zdd,
  DdNode * P,
  DdNode * zvar)
{
    int         top_var, level;
    DdNode      *res, *t, *e;
    DdNode      *base = DD_ONE(zdd);
    DdNode      *empty = DD_ZERO(zdd);

    statLine(zdd);
    if (P == empty)
        return(empty);
    if (P == base)
        return(zvar);

    /* Check cache. */
    res = cuddCacheLookup2Zdd(zdd, cuddZddChangeAux, P, zvar);
    if (res != NULL)
        return(res);

    top_var = zdd->permZ[P->index];
    level = zdd->permZ[zvar->index];

    if (top_var > level) {
        res = cuddZddGetNode(zdd, zvar->index, P, DD_ZERO(zdd));
        if (res == NULL) return(NULL);
    } else if (top_var == level) {
        res = cuddZddGetNode(zdd, zvar->index, cuddE(P), cuddT(P));
        if (res == NULL) return(NULL);
    } else {
        t = cuddZddChangeAux(zdd, cuddT(P), zvar);
        if (t == NULL) return(NULL);
        cuddRef(t);
        e = cuddZddChangeAux(zdd, cuddE(P), zvar);
        if (e == NULL) {
            Cudd_RecursiveDerefZdd(zdd, t);
            return(NULL);
        }
        cuddRef(e);
        res = cuddZddGetNode(zdd, P->index, t, e);
        if (res == NULL) {
            Cudd_RecursiveDerefZdd(zdd, t);
            Cudd_RecursiveDerefZdd(zdd, e);
            return(NULL);
        }
        cuddDeref(t);
        cuddDeref(e);
    }

    cuddCacheInsert2(zdd, cuddZddChangeAux, P, zvar, res);

    return(res);

}